

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

ssize_t zt_cstr_itoa(char *s,int value,size_t offset,size_t bufsiz)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  
  sVar1 = zt_cstr_int_display_len(value);
  uVar2 = sVar1 + offset;
  uVar4 = 0xffffffffffffffff;
  if (uVar2 <= bufsiz && s != (char *)0x0) {
    if (value < 0) {
      s[offset] = '-';
    }
    pcVar3 = s + uVar2;
    *pcVar3 = '\0';
    do {
      pcVar3 = pcVar3 + -1;
      *pcVar3 = "9876543210123456789"[(long)(value % 10) + 9];
      uVar5 = value + 9;
      uVar4 = uVar2;
      value = value / 10;
    } while (0x12 < uVar5);
  }
  return uVar4;
}

Assistant:

ssize_t zt_cstr_itoa(char *s, int value, size_t offset, size_t bufsiz)
{
    size_t    loc;
    ssize_t   result;

    result = loc = offset + zt_cstr_int_display_len(value);

    if ((s == NULL) || (loc > bufsiz)) {
        return -1;
    }

    if (value < 0) {
        s[offset] = '-';
    }

    s[loc] = 0;
    loc--;

    do {
        s[loc] = *(_itoa_integers + 9 + (value % 10));
        value /= 10;
        loc--;
    } while(value != 0);

    return result;
}